

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,mbedtls_mpi *Y,uchar swap)

{
  mbedtls_mpi_uint *pmVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  mbedtls_mpi_uint mVar6;
  mbedtls_mpi_uint mVar7;
  
  iVar3 = 0;
  if (((X != Y) && (iVar3 = mbedtls_mpi_grow(X,Y->n), iVar3 == 0)) &&
     (iVar3 = mbedtls_mpi_grow(Y,X->n), iVar3 == 0)) {
    iVar3 = X->s;
    iVar4 = Y->s;
    if (swap == '\0') {
      iVar4 = iVar3;
    }
    X->s = iVar4;
    if (swap == '\0') {
      iVar3 = Y->s;
    }
    Y->s = iVar3;
    iVar3 = 0;
    if (X->n != 0) {
      pmVar1 = X->p;
      pmVar2 = Y->p;
      iVar3 = 0;
      uVar5 = 0;
      do {
        mVar6 = pmVar1[uVar5];
        mVar7 = pmVar2[uVar5];
        if (swap == '\0') {
          mVar7 = mVar6;
        }
        pmVar1[uVar5] = mVar7;
        if (swap == '\0') {
          mVar6 = pmVar2[uVar5];
        }
        pmVar2[uVar5] = mVar6;
        uVar5 = uVar5 + 1;
      } while (uVar5 < X->n);
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_safe_cond_swap( mbedtls_mpi *X, mbedtls_mpi *Y, unsigned char swap )
{
    int ret, s;
    size_t i;
    mbedtls_mpi_uint tmp;

    if( X == Y )
        return( 0 );

    /* make sure swap is 0 or 1 in a time-constant manner */
    swap = (swap | (unsigned char)-swap) >> 7;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, Y->n ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( Y, X->n ) );

    s = X->s;
    X->s = X->s * ( 1 - swap ) + Y->s * swap;
    Y->s = Y->s * ( 1 - swap ) +    s * swap;


    for( i = 0; i < X->n; i++ )
    {
        tmp = X->p[i];
        X->p[i] = X->p[i] * ( 1 - swap ) + Y->p[i] * swap;
        Y->p[i] = Y->p[i] * ( 1 - swap ) +     tmp * swap;
    }

cleanup:
    return( ret );
}